

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> __thiscall
enact::Parser::parseReturnStmt(Parser *this)

{
  long in_RSI;
  Token keyword;
  undefined1 local_50 [24];
  string local_38 [40];
  
  Token::Token((Token *)(local_50 + 0x10),(Token *)(in_RSI + 0xb0));
  if (*(int *)(in_RSI + 0xe0) == 0x10) {
    std::make_unique<enact::UnitExpr,enact::Token&>((Token *)local_50);
  }
  else {
    parseExpr((Parser *)local_50);
  }
  local_50._8_8_ = local_50._0_8_;
  std::
  make_unique<enact::ReturnStmt,enact::Token&,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>>
            ((Token *)local_50,
             (unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)(local_50 + 0x10));
  this->m_context = (CompileContext *)local_50._0_8_;
  if ((CompileContext *)local_50._8_8_ != (CompileContext *)0x0) {
    (**(code **)(*(long *)local_50._8_8_ + 8))();
  }
  std::__cxx11::string::~string(local_38);
  return (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)
         (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Stmt> Parser::parseReturnStmt() {
        Token keyword = m_previous;
        std::unique_ptr<Expr> value;
        if (check(TokenType::SEMICOLON)) {
            value = std::make_unique<UnitExpr>(m_current);
        } else {
            value = parseExpr();
        }

        return std::make_unique<ReturnStmt>(keyword, std::move(value));
    }